

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcolj.c
# Opt level: O3

int fffstri8(char *input,long ntodo,double scale,double zero,long twidth,double implipower,
            int nullcheck,char *snull,LONGLONG nullval,char *nullarray,int *anynull,LONGLONG *output
            ,int *status)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  double dVar4;
  uint uVar5;
  byte bVar6;
  byte bVar7;
  int iVar8;
  size_t sVar9;
  int iVar10;
  byte *pbVar11;
  long lVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  char message [81];
  char local_88 [88];
  
  if (0 < ntodo) {
    sVar9 = strlen(snull);
    lVar12 = 0;
    do {
      pbVar2 = (byte *)input + twidth;
      bVar3 = ((byte *)input)[twidth];
      ((byte *)input)[twidth] = 0;
      pbVar11 = (byte *)input;
      if ((*snull == '\x01') || (iVar8 = strncmp(snull,input,(long)(int)sVar9), iVar8 != 0)) {
        for (; bVar7 = *pbVar11, bVar7 == 0x20; pbVar11 = pbVar11 + 1) {
        }
        if ((bVar7 == 0x2b) || (bVar7 == 0x2d)) {
          do {
            pbVar1 = pbVar11 + 1;
            pbVar11 = pbVar11 + 1;
          } while (*pbVar1 == 0x20);
          dVar14 = *(double *)(&DAT_001ceb20 + (ulong)(bVar7 == 0x2d) * 8);
          bVar7 = *pbVar1;
        }
        else {
          dVar14 = 1.0;
        }
        dVar15 = 0.0;
        while ((byte)(bVar7 - 0x30) < 10) {
          uVar5 = (uint)bVar7;
          do {
            bVar7 = pbVar11[1];
            pbVar11 = pbVar11 + 1;
          } while (bVar7 == 0x20);
          dVar15 = dVar15 * 10.0 + (double)uVar5 + -48.0;
        }
        dVar13 = implipower;
        if ((bVar7 | 2) == 0x2e) {
          do {
            bVar7 = pbVar11[1];
            pbVar11 = pbVar11 + 1;
          } while (bVar7 == 0x20);
          dVar13 = 1.0;
          while ((byte)(bVar7 - 0x30) < 10) {
            dVar15 = dVar15 * 10.0 + (double)bVar7 + -48.0;
            do {
              bVar7 = pbVar11[1];
              pbVar11 = pbVar11 + 1;
            } while (bVar7 == 0x20);
            dVar13 = dVar13 * 10.0;
          }
        }
        iVar10 = 1;
        iVar8 = 0;
        if ((bVar7 & 0xfe) == 0x44) {
          do {
            bVar7 = pbVar11[1];
            pbVar11 = pbVar11 + 1;
          } while (bVar7 == 0x20);
          if ((bVar7 == 0x2d) || (bVar7 == 0x2b)) {
            do {
              pbVar1 = pbVar11 + 1;
              pbVar11 = pbVar11 + 1;
            } while (*pbVar1 == 0x20);
            iVar10 = (uint)(bVar7 != 0x2d) * 2 + -1;
            bVar7 = *pbVar1;
          }
          else {
            iVar10 = 1;
          }
          if ((byte)(bVar7 - 0x30) < 10) {
            iVar8 = 0;
            bVar6 = bVar7;
            do {
              do {
                bVar7 = pbVar11[1];
                pbVar11 = pbVar11 + 1;
              } while (bVar7 == 0x20);
              iVar8 = iVar8 * 10 + -0x30 + (int)(char)bVar6;
              bVar6 = bVar7;
            } while ((byte)(bVar7 - 0x30) < 10);
          }
        }
        if (bVar7 != 0) {
          builtin_strncpy(local_88,"Cannot read number from ASCII table",0x24);
          ffpmsg(local_88);
          snprintf(local_88,0x51,"Column field = %s.",input);
          ffpmsg(local_88);
          *pbVar2 = bVar3;
          *status = 0x199;
          return 0x199;
        }
        dVar4 = pow(10.0,(double)(iVar10 * iVar8));
        dVar14 = dVar4 * ((dVar15 * dVar14) / dVar13) * scale + zero;
        input = (char *)pbVar11;
        if (-9.223372036854776e+18 <= dVar14) {
          if (dVar14 <= 9.223372036854776e+18) {
            output[lVar12] = (long)dVar14;
          }
          else {
            *status = -0xb;
            output[lVar12] = 0x7fffffffffffffff;
          }
        }
        else {
          *status = -0xb;
          output[lVar12] = -0x8000000000000000;
        }
      }
      else {
        input = (char *)pbVar2;
        if (nullcheck != 0) {
          *anynull = 1;
          if (nullcheck == 1) {
            output[lVar12] = nullval;
          }
          else {
            nullarray[lVar12] = '\x01';
          }
        }
      }
      *pbVar2 = bVar3;
      lVar12 = lVar12 + 1;
    } while (lVar12 != ntodo);
  }
  return *status;
}

Assistant:

int fffstri8(char *input,         /* I - array of values to be converted     */
            long ntodo,           /* I - number of elements in the array     */
            double scale,         /* I - FITS TSCALn or BSCALE value         */
            double zero,          /* I - FITS TZEROn or BZERO  value         */
            long twidth,          /* I - width of each substring of chars    */
            double implipower,    /* I - power of 10 of implied decimal      */
            int nullcheck,        /* I - null checking code; 0 = don't check */
                                  /*     1:set null pixels = nullval         */
                                  /*     2: if null pixel, set nullarray = 1 */
            char  *snull,         /* I - value of FITS null string, if any   */
            LONGLONG nullval,     /* I - set null pixels, if nullcheck = 1   */
            char *nullarray,      /* I - bad pixel array, if nullcheck = 2   */
            int  *anynull,        /* O - set to 1 if any pixels are null     */
            LONGLONG *output,     /* O - array of converted pixels           */
            int *status)          /* IO - error status                       */
/*
  Copy input to output following reading of the input from a FITS file. Check
  for null values and do scaling if required. The nullcheck code value
  determines how any null values in the input array are treated. A null
  value is an input pixel that is equal to snull.  If nullcheck= 0, then
  no special checking for nulls is performed.  If nullcheck = 1, then the
  output pixel will be set = nullval if the corresponding input pixel is null.
  If nullcheck = 2, then if the pixel is null then the corresponding value of
  nullarray will be set to 1; the value of nullarray for non-null pixels 
  will = 0.  The anynull parameter will be set = 1 if any of the returned
  pixels are null, otherwise anynull will be returned with a value = 0;
*/
{
    int nullen;
    long ii;
    double dvalue;
    char *cstring, message[FLEN_ERRMSG];
    char *cptr, *tpos;
    char tempstore, chrzero = '0';
    double val, power;
    int exponent, sign, esign, decpt;

    nullen = strlen(snull);
    cptr = input;  /* pointer to start of input string */
    for (ii = 0; ii < ntodo; ii++)
    {
      cstring = cptr;
      /* temporarily insert a null terminator at end of the string */
      tpos = cptr + twidth;
      tempstore = *tpos;
      *tpos = 0;

      /* check if null value is defined, and if the    */
      /* column string is identical to the null string */
      if (snull[0] != ASCII_NULL_UNDEFINED && 
         !strncmp(snull, cptr, nullen) )
      {
        if (nullcheck)  
        {
          *anynull = 1;    
          if (nullcheck == 1)
            output[ii] = nullval;
          else
            nullarray[ii] = 1;
        }
        cptr += twidth;
      }
      else
      {
        /* value is not the null value, so decode it */
        /* remove any embedded blank characters from the string */

        decpt = 0;
        sign = 1;
        val  = 0.;
        power = 1.;
        exponent = 0;
        esign = 1;

        while (*cptr == ' ')               /* skip leading blanks */
           cptr++;

        if (*cptr == '-' || *cptr == '+')  /* check for leading sign */
        {
          if (*cptr == '-')
             sign = -1;

          cptr++;

          while (*cptr == ' ')         /* skip blanks between sign and value */
            cptr++;
        }

        while (*cptr >= '0' && *cptr <= '9')
        {
          val = val * 10. + *cptr - chrzero;  /* accumulate the value */
          cptr++;

          while (*cptr == ' ')         /* skip embedded blanks in the value */
            cptr++;
        }

        if (*cptr == '.' || *cptr == ',')    /* check for decimal point */
        {
          decpt = 1;       /* set flag to show there was a decimal point */
          cptr++;
          while (*cptr == ' ')         /* skip any blanks */
            cptr++;

          while (*cptr >= '0' && *cptr <= '9')
          {
            val = val * 10. + *cptr - chrzero;  /* accumulate the value */
            power = power * 10.;
            cptr++;

            while (*cptr == ' ')         /* skip embedded blanks in the value */
              cptr++;
          }
        }

        if (*cptr == 'E' || *cptr == 'D')  /* check for exponent */
        {
          cptr++;
          while (*cptr == ' ')         /* skip blanks */
              cptr++;
  
          if (*cptr == '-' || *cptr == '+')  /* check for exponent sign */
          {
            if (*cptr == '-')
               esign = -1;

            cptr++;

            while (*cptr == ' ')        /* skip blanks between sign and exp */
              cptr++;
          }

          while (*cptr >= '0' && *cptr <= '9')
          {
            exponent = exponent * 10 + *cptr - chrzero;  /* accumulate exp */
            cptr++;

            while (*cptr == ' ')         /* skip embedded blanks */
              cptr++;
          }
        }

        if (*cptr  != 0)  /* should end up at the null terminator */
        {
          snprintf(message, FLEN_ERRMSG, "Cannot read number from ASCII table");
          ffpmsg(message);
          snprintf(message, FLEN_ERRMSG,"Column field = %s.", cstring);
          ffpmsg(message);
          /* restore the char that was overwritten by the null */
          *tpos = tempstore;
          return(*status = BAD_C2D);
        }

        if (!decpt)  /* if no explicit decimal, use implied */
           power = implipower;

        dvalue = (sign * val / power) * pow(10., (double) (esign * exponent));

        dvalue = dvalue * scale + zero;   /* apply the scaling */

        if (dvalue < DLONGLONG_MIN)
        {
            *status = OVERFLOW_ERR;
            output[ii] = LONGLONG_MIN;
        }
        else if (dvalue > DLONGLONG_MAX)
        {
            *status = OVERFLOW_ERR;
            output[ii] = LONGLONG_MAX;
        }
        else
            output[ii] = (LONGLONG) dvalue;
      }
      /* restore the char that was overwritten by the null */
      *tpos = tempstore;
    }
    return(*status);
}